

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderAdjacencyTests.cpp
# Opt level: O1

void __thiscall
glcts::GeometryShaderAdjacencyTests::createGridLineStrip
          (GeometryShaderAdjacencyTests *this,AdjacencyTestData *test_data)

{
  AdjacencyGrid *pAVar1;
  uint uVar2;
  AdjacencyGridPoint *pAVar3;
  GLfloat *pGVar4;
  long lVar5;
  ulong uVar6;
  AdjacencyGridPoint **ppAVar7;
  
  pAVar1 = test_data->m_grid;
  uVar2 = pAVar1->m_n_points + 2;
  (pAVar1->m_line_strip).m_n_points = uVar2;
  pAVar3 = (AdjacencyGridPoint *)operator_new__((ulong)uVar2 * 0xc);
  (pAVar1->m_line_strip).m_points = pAVar3;
  memset(pAVar3,0,(ulong)(pAVar1->m_line_strip).m_n_points * 0xc);
  uVar2 = (pAVar1->m_line_strip).m_n_points;
  if ((ulong)uVar2 != 0) {
    pGVar4 = &((pAVar1->m_line_strip).m_points)->y;
    lVar5 = -0x10;
    uVar6 = 0;
    do {
      ((AdjacencyGridPoint *)(pGVar4 + -2))->index = (GLuint)uVar6;
      if (uVar6 == 0) {
        ppAVar7 = &pAVar1->m_line_segments->m_point_start_adjacent;
      }
      else if (uVar2 - 1 == uVar6) {
        ppAVar7 = &pAVar1->m_line_segments[pAVar1->m_n_segments - 1].m_point_end_adjacent;
      }
      else {
        ppAVar7 = (AdjacencyGridPoint **)((long)&pAVar1->m_line_segments->m_point_end + lVar5);
      }
      pAVar3 = *ppAVar7;
      pGVar4[-1] = pAVar3->x;
      *pGVar4 = pAVar3->y;
      uVar6 = uVar6 + 1;
      pGVar4 = pGVar4 + 3;
      lVar5 = lVar5 + 0x20;
    } while (uVar2 != uVar6);
  }
  return;
}

Assistant:

void GeometryShaderAdjacencyTests::createGridLineStrip(AdjacencyTestData& test_data)
{
	/* Add 2 extra point for adjacency start+end points */
	test_data.m_grid->m_line_strip.m_n_points = test_data.m_grid->m_n_points + 2;
	test_data.m_grid->m_line_strip.m_points   = new AdjacencyGridPoint[test_data.m_grid->m_line_strip.m_n_points];

	memset(test_data.m_grid->m_line_strip.m_points, 0,
		   sizeof(AdjacencyGridPoint) * test_data.m_grid->m_line_strip.m_n_points);

	for (unsigned int n = 0; n < test_data.m_grid->m_line_strip.m_n_points; ++n)
	{
		AdjacencyGridPoint* pointPtr = test_data.m_grid->m_line_strip.m_points + n;

		pointPtr->index = n;

		/* If this is a start point, use any of the adjacent points */
		if (n == 0)
		{
			pointPtr->x = test_data.m_grid->m_line_segments[0].m_point_start_adjacent->x;
			pointPtr->y = test_data.m_grid->m_line_segments[0].m_point_start_adjacent->y;
		}
		else
			/* Last point should be handled analogously */
			if (n == (test_data.m_grid->m_line_strip.m_n_points - 1))
		{
			pointPtr->x = test_data.m_grid->m_line_segments[test_data.m_grid->m_n_segments - 1].m_point_end_adjacent->x;
			pointPtr->y = test_data.m_grid->m_line_segments[test_data.m_grid->m_n_segments - 1].m_point_end_adjacent->y;
		}
		else
		/* Intermediate points */
		{
			pointPtr->x = test_data.m_grid->m_line_segments[n - 1].m_point_start->x;
			pointPtr->y = test_data.m_grid->m_line_segments[n - 1].m_point_start->y;
		}
	} /* for (all points) */
}